

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void armci_msg_rcv(int tag,void *buffer,int len,int *msglen,int from)

{
  int iVar1;
  MPI_Comm poVar2;
  int flag;
  int self;
  MPI_Request request;
  MPI_Status status;
  int local_50;
  int local_4c;
  undefined1 local_48 [8];
  undefined1 local_40 [24];
  
  poVar2 = wc();
  local_50 = 0;
  iVar1 = MPI_Comm_rank(poVar2,&local_4c);
  if (iVar1 != 0) {
    __assert_fail("MPI_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,399,"void armci_msg_rcv(int, void *, int, int *, int)");
  }
  if (tag != 0x6be8) {
    poVar2 = wc();
    iVar1 = MPI_Irecv(buffer,len,&ompi_mpi_char,from,tag,poVar2,local_48);
    if (iVar1 != 0) {
      __assert_fail("MPI_SUCCESS == rc",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x194,"void armci_msg_rcv(int, void *, int, int *, int)");
    }
    if ((local_4c == from) && ((self_request_flag & 1) != 0)) {
      do {
        MPI_Test(&self_request,&local_50,local_40);
        comex_make_progress();
      } while (local_50 == 0);
      self_request = (MPI_Request)&ompi_request_null;
      self_request_flag = 0;
    }
    do {
      MPI_Test(local_48,&local_50,local_40);
      comex_make_progress();
    } while (local_50 == 0);
    if (msglen != (int *)0x0) {
      iVar1 = MPI_Get_count(local_40,&ompi_mpi_char,msglen);
      if (iVar1 != 0) {
        __assert_fail("MPI_SUCCESS == rc",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                      ,0x1aa,"void armci_msg_rcv(int, void *, int, int *, int)");
      }
    }
    return;
  }
  __assert_fail("COMEX_TAG != tag",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                ,0x191,"void armci_msg_rcv(int, void *, int, int *, int)");
}

Assistant:

void armci_msg_rcv(int tag, void* buffer, int len, int *msglen, int from)
{
    MPI_Comm comm = wc();
    MPI_Request request;
    MPI_Status status;
    int self;
    int flag = 0;
    int rc;

    rc = MPI_Comm_rank(comm, &self);
    assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
    assert(COMEX_TAG != tag);
#endif
    rc = MPI_Irecv(buffer, len, MPI_CHAR, from, tag, wc(), &request);
    assert(MPI_SUCCESS == rc);
    if (from == self && self_request_flag) {
        do {
            MPI_Test(&self_request, &flag, &status);
            assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
            comex_make_progress();
#endif
        } while (!flag);
        self_request = MPI_REQUEST_NULL;
        self_request_flag = 0;
    }
    do {
        MPI_Test(&request, &flag, &status);
        assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
        comex_make_progress();
#endif
    } while (!flag);

    if(msglen) {
        rc = MPI_Get_count(&status, MPI_CHAR, msglen);
        assert(MPI_SUCCESS == rc);
    }
}